

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::InsertScanbeam(Clipper *this,long64 Y)

{
  bool bVar1;
  Scanbeam *pSVar2;
  Scanbeam *newSb_1;
  Scanbeam *sb2;
  Scanbeam *newSb;
  long64 Y_local;
  Clipper *this_local;
  
  if (this->m_Scanbeam == (Scanbeam *)0x0) {
    pSVar2 = (Scanbeam *)operator_new(0x10);
    this->m_Scanbeam = pSVar2;
    this->m_Scanbeam->next = (Scanbeam *)0x0;
    this->m_Scanbeam->Y = Y;
  }
  else if (this->m_Scanbeam->Y < Y) {
    pSVar2 = (Scanbeam *)operator_new(0x10);
    pSVar2->Y = Y;
    pSVar2->next = this->m_Scanbeam;
    this->m_Scanbeam = pSVar2;
  }
  else {
    newSb_1 = this->m_Scanbeam;
    while( true ) {
      bVar1 = false;
      if (newSb_1->next != (Scanbeam *)0x0) {
        bVar1 = Y <= newSb_1->next->Y;
      }
      if (!bVar1) break;
      newSb_1 = newSb_1->next;
    }
    if (Y != newSb_1->Y) {
      pSVar2 = (Scanbeam *)operator_new(0x10);
      pSVar2->Y = Y;
      pSVar2->next = newSb_1->next;
      newSb_1->next = pSVar2;
    }
  }
  return;
}

Assistant:

void Clipper::InsertScanbeam(const long64 Y)
{
  if( !m_Scanbeam )
  {
    m_Scanbeam = new Scanbeam;
    m_Scanbeam->next = 0;
    m_Scanbeam->Y = Y;
  }
  else if(  Y > m_Scanbeam->Y )
  {
    Scanbeam* newSb = new Scanbeam;
    newSb->Y = Y;
    newSb->next = m_Scanbeam;
    m_Scanbeam = newSb;
  } else
  {
    Scanbeam* sb2 = m_Scanbeam;
    while( sb2->next  && ( Y <= sb2->next->Y ) ) sb2 = sb2->next;
    if(  Y == sb2->Y ) return; //ie ignores duplicates
    Scanbeam* newSb = new Scanbeam;
    newSb->Y = Y;
    newSb->next = sb2->next;
    sb2->next = newSb;
  }
}